

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3ExprParse
              (sqlite3_tokenizer *pTokenizer,int iLangid,char **azCol,int bFts4,int nCol,
              int iDefaultCol,char *z,int n,Fts3Expr **ppExpr,char **pzErr)

{
  undefined4 in_ECX;
  undefined8 in_RDI;
  int nMaxDepth;
  undefined4 in_R8D;
  int in_R9D;
  Fts3Expr **unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  long *in_stack_00000018;
  int rc;
  int in_stack_00000048;
  undefined8 uVar1;
  int in_stack_ffffffffffffffc4;
  char **in_stack_ffffffffffffffd0;
  int local_28;
  int nMaxDepth_00;
  
  nMaxDepth = (int)((ulong)in_RDI >> 0x20);
  uVar1 = in_stack_00000008;
  local_28 = fts3ExprParseUnbalanced
                       ((sqlite3_tokenizer *)CONCAT44(in_ECX,in_R8D),in_R9D,
                        in_stack_ffffffffffffffd0,(int)((ulong)in_stack_00000018 >> 0x20),
                        (int)in_stack_00000018,in_stack_ffffffffffffffc4,(char *)pTokenizer,
                        in_stack_00000048,(Fts3Expr **)z);
  nMaxDepth_00 = (int)((ulong)uVar1 >> 0x20);
  if (((local_28 == 0) && (*in_stack_00000018 != 0)) &&
     (local_28 = fts3ExprBalance(unaff_retaddr,nMaxDepth), local_28 == 0)) {
    local_28 = fts3ExprCheckDepth((Fts3Expr *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_00000010),
                                  nMaxDepth_00);
  }
  if (local_28 != 0) {
    sqlite3Fts3ExprFree((Fts3Expr *)CONCAT44(in_ECX,in_R8D));
    *in_stack_00000018 = 0;
    if (local_28 == 0x12) {
      sqlite3Fts3ErrMsg((char **)CONCAT44(iDefaultCol,rc),
                        "FTS expression tree is too large (maximum depth %d)",0xc);
      local_28 = 1;
    }
    else if (local_28 == 1) {
      sqlite3Fts3ErrMsg((char **)CONCAT44(iDefaultCol,rc),"malformed MATCH expression: [%s]",
                        in_stack_00000008);
    }
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3ExprParse(
  sqlite3_tokenizer *pTokenizer,      /* Tokenizer module */
  int iLangid,                        /* Language id for tokenizer */
  char **azCol,                       /* Array of column names for fts3 table */
  int bFts4,                          /* True to allow FTS4-only syntax */
  int nCol,                           /* Number of entries in azCol[] */
  int iDefaultCol,                    /* Default column to query */
  const char *z, int n,               /* Text of MATCH query */
  Fts3Expr **ppExpr,                  /* OUT: Parsed query structure */
  char **pzErr                        /* OUT: Error message (sqlite3_malloc) */
){
  int rc = fts3ExprParseUnbalanced(
      pTokenizer, iLangid, azCol, bFts4, nCol, iDefaultCol, z, n, ppExpr
  );

  /* Rebalance the expression. And check that its depth does not exceed
  ** SQLITE_FTS3_MAX_EXPR_DEPTH.  */
  if( rc==SQLITE_OK && *ppExpr ){
    rc = fts3ExprBalance(ppExpr, SQLITE_FTS3_MAX_EXPR_DEPTH);
    if( rc==SQLITE_OK ){
      rc = fts3ExprCheckDepth(*ppExpr, SQLITE_FTS3_MAX_EXPR_DEPTH);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(*ppExpr);
    *ppExpr = 0;
    if( rc==SQLITE_TOOBIG ){
      sqlite3Fts3ErrMsg(pzErr,
          "FTS expression tree is too large (maximum depth %d)",
          SQLITE_FTS3_MAX_EXPR_DEPTH
      );
      rc = SQLITE_ERROR;
    }else if( rc==SQLITE_ERROR ){
      sqlite3Fts3ErrMsg(pzErr, "malformed MATCH expression: [%s]", z);
    }
  }

  return rc;
}